

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O0

void RigidBodyDynamics::ForwardDynamicsApplyConstraintForces
               (Model *model,VectorNd *Tau,ConstraintSet *CS,VectorNd *QDDot)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  CoeffReturnType pdVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  long in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  ReturnType RVar11;
  Vector3d qdd_temp;
  SpatialTransform X_lambda;
  uint lambda_2;
  uint q_index_1;
  SpatialVector pa_1;
  SpatialMatrix Ia_1;
  uint lambda_1;
  SpatialVector pa;
  SpatialMatrix Ia;
  uint lambda;
  uint q_index;
  uint i;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_ffffffffffffef08;
  SpatialTransform *other;
  SpatialTransform *in_stack_ffffffffffffef10;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_ffffffffffffef18;
  Scalar SVar12;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_ffffffffffffef20;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
  *in_stack_ffffffffffffef28;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
  *in_stack_ffffffffffffef30;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_ffffffffffffef38;
  double *in_stack_ffffffffffffef48;
  double *in_stack_ffffffffffffef50;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_ffffffffffffef58;
  Vector3_t *in_stack_ffffffffffffef60;
  Scalar SVar13;
  double *in_stack_ffffffffffffef68;
  double *in_stack_ffffffffffffef70;
  reference in_stack_ffffffffffffef78;
  reference in_stack_ffffffffffffef80;
  reference in_stack_ffffffffffffef88;
  reference in_stack_ffffffffffffef90;
  reference in_stack_ffffffffffffefa0;
  SpatialVector *in_stack_fffffffffffff040;
  SpatialVector *in_stack_fffffffffffff048;
  SpatialRigidBodyInertia *in_stack_fffffffffffff0b8;
  SpatialVector *in_stack_fffffffffffff0d0;
  SpatialTransform *in_stack_fffffffffffff0d8;
  SpatialTransform *in_stack_fffffffffffff100;
  SpatialTransform *in_stack_fffffffffffff110;
  SpatialVector *in_stack_fffffffffffff130;
  SpatialRigidBodyInertia *in_stack_fffffffffffff138;
  SpatialTransform local_e58;
  Matrix<double,_6,_1,_0,_6,_1> *local_df0;
  Matrix<double,_6,_6,_0,_6,_6> *local_db0;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0> local_b60;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_ad8;
  value_type local_844;
  Matrix<double,_6,_1,_0,_6,_1> *local_840;
  Matrix<double,_6,_6,_0,_6,_6> *local_800;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0> local_5b0;
  Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_588;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_560;
  non_const_type local_4b0;
  Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_4a8;
  non_const_type local_330;
  Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
  local_328;
  value_type local_2e0;
  uint local_2dc;
  Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> local_1b8;
  uint local_24;
  long local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_24 = 1; uVar4 = (ulong)local_24,
      sVar5 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&local_8[0x20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_finish), uVar4 < sVar5;
      local_24 = local_24 + 1) {
    std::
    vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  *)(local_8 + 0x1a),(ulong)local_24);
    Math::SpatialRigidBodyInertia::toMatrix(in_stack_fffffffffffff0b8);
    std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
              ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
               &local_8[0x14].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    SpatialMatrix_t::operator=
              ((SpatialMatrix_t *)in_stack_ffffffffffffef10,
               (SpatialMatrix_t *)in_stack_ffffffffffffef08);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    std::
    vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  *)(local_8 + 0x1a),(ulong)local_24);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    Math::SpatialRigidBodyInertia::operator*(in_stack_fffffffffffff138,in_stack_fffffffffffff130);
    Math::crossf(in_stack_fffffffffffff048,in_stack_fffffffffffff040);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &local_8[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_ffffffffffffef10,
               (SpatialVector_t *)in_stack_ffffffffffffef08);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (local_18 + 0x238),(ulong)local_24);
    bVar3 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator!=
                      (in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
    if (bVar3) {
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(local_8 + 0x1e),(ulong)local_24);
      Math::SpatialTransform::toMatrixAdjoint(in_stack_fffffffffffff100);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_18 + 0x238),(ulong)local_24);
      local_1b8 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                            ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                             in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator-=
                ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffef30,
                 in_stack_ffffffffffffef28);
    }
  }
  sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
          size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)&local_8[0x20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
  local_24 = (uint)sVar5;
  while (local_24 = local_24 - 1, local_24 != 0) {
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&local_8[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    local_2dc = pvVar6->q_index;
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&local_8[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    if (pvVar6->mDoFCount == 3) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_24);
      local_2e0 = *pvVar7;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                 in_stack_ffffffffffffef10,(Index)in_stack_ffffffffffffef08);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                 in_stack_ffffffffffffef10,(Index)in_stack_ffffffffffffef08);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                 in_stack_ffffffffffffef10,(Index)in_stack_ffffffffffffef08);
      Vector3_t::Vector3_t
                (in_stack_ffffffffffffef60,(double *)in_stack_ffffffffffffef58,
                 in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&local_8[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      local_330 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                             in_stack_ffffffffffffef08);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      local_328 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                            ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *
                             )in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffef38,
                 (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)in_stack_ffffffffffffef30);
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)
                 &local_8[0x11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      Vector3_t::operator=
                ((Vector3_t *)in_stack_ffffffffffffef10,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                  *)in_stack_ffffffffffffef08);
      if (local_2e0 != 0) {
        std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                  ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                   &local_8[0x14].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        std::
        vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      *)&local_8[0xf].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::operator[]
                  ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)
                   &local_8[0x10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        local_4a8 = Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                              ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                               in_stack_ffffffffffffef10,
                               (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                               in_stack_ffffffffffffef08);
        std::
        vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      *)&local_8[0xf].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        local_4b0 = (non_const_type)
                    Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                              ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                               in_stack_ffffffffffffef08);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
        ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                     *)in_stack_ffffffffffffef20,
                    (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                    in_stack_ffffffffffffef18);
        Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator-
                  ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_ffffffffffffef38,
                   (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>
                    *)in_stack_ffffffffffffef30);
        SpatialMatrix_t::
        SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>const>>
                  ((SpatialMatrix_t *)in_stack_ffffffffffffef10,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                    *)in_stack_ffffffffffffef08);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &local_8[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &local_8[0x13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        local_560 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                              ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                               in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  (in_stack_ffffffffffffef38,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)in_stack_ffffffffffffef30);
        std::
        vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      *)&local_8[0xf].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::operator[]
                  ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)
                   &local_8[0x10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        local_588 = Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                              ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                               in_stack_ffffffffffffef10,
                               (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                               in_stack_ffffffffffffef08);
        std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                  ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)
                   &local_8[0x11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
        ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                     *)in_stack_ffffffffffffef20,
                    (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffef18);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>>
        ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                     *)in_stack_ffffffffffffef38,
                    (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                     *)in_stack_ffffffffffffef30);
        SpatialVector_t::
        SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                  ((SpatialVector_t *)in_stack_ffffffffffffef10,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)in_stack_ffffffffffffef08);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(local_8 + 0x1d),(ulong)local_24);
        Math::SpatialTransform::toMatrixTranspose(in_stack_fffffffffffff110);
        local_5b0 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                              ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                               in_stack_ffffffffffffef10,
                               (MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                               in_stack_ffffffffffffef08);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(local_8 + 0x1d),(ulong)local_24);
        Math::SpatialTransform::toMatrix(in_stack_fffffffffffff100);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>>
        ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                     *)in_stack_ffffffffffffef20,
                    (MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_ffffffffffffef18);
        std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                  ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                   &local_8[0x14].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_2e0);
        local_800 = (Matrix<double,_6,_6,_0,_6,_6> *)
                    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::noalias
                              ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                               in_stack_ffffffffffffef08);
        Eigen::NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::MatrixBase> *)
                   in_stack_ffffffffffffef30,
                   (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                    *)in_stack_ffffffffffffef28);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(local_8 + 0x1d),(ulong)local_24);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &local_8[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_2e0);
        local_840 = (Matrix<double,_6,_1,_0,_6,_1> *)
                    Eigen::MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::noalias
                              (in_stack_ffffffffffffef08);
        Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::MatrixBase> *)
                   in_stack_ffffffffffffef30,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffef28);
      }
    }
    else {
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          in_stack_ffffffffffffef10,(Index)in_stack_ffffffffffffef08);
      dVar1 = *pdVar8;
      in_stack_ffffffffffffefa0 =
           std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                     ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                      &local_8[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      RVar11 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
               dot<Eigen::Matrix<double,6,1,0,6,1>>
                         ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                          in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffef10,(Index)in_stack_ffffffffffffef08);
      *pSVar9 = dVar1 - RVar11;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_24);
      local_844 = *pvVar7;
      if (local_844 != 0) {
        in_stack_ffffffffffffef88 =
             std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                       ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                        &local_8[0x14].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        in_stack_ffffffffffffef80 =
             std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                       ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                        &local_8[0x16].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        in_stack_ffffffffffffef78 =
             std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                       ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                        &local_8[0x16].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                   in_stack_ffffffffffffef10,(Index)in_stack_ffffffffffffef08);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator/
                  (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
        Eigen::
        DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
        ::transpose((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                     *)in_stack_ffffffffffffef18);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffef28,
                   (MatrixBase<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                    *)in_stack_ffffffffffffef20);
        Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator-
                  ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_ffffffffffffef38,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>
                    *)in_stack_ffffffffffffef30);
        SpatialMatrix_t::
        SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>,0>const>>
                  ((SpatialMatrix_t *)in_stack_ffffffffffffef10,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>_>
                    *)in_stack_ffffffffffffef08);
        in_stack_ffffffffffffef90 =
             std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                       ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                        &local_8[0x15].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &local_8[0x13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        local_ad8 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                              ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                               in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  (in_stack_ffffffffffffef38,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)in_stack_ffffffffffffef30);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &local_8[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                   in_stack_ffffffffffffef10,(Index)in_stack_ffffffffffffef08);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                  (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                   in_stack_ffffffffffffef10,(Index)in_stack_ffffffffffffef08);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>>
        ::operator/((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                     *)in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>>
        ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                     *)in_stack_ffffffffffffef38,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                     *)in_stack_ffffffffffffef30);
        SpatialVector_t::
        SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                  ((SpatialVector_t *)in_stack_ffffffffffffef10,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                    *)in_stack_ffffffffffffef08);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(local_8 + 0x1d),(ulong)local_24);
        Math::SpatialTransform::toMatrixTranspose(in_stack_fffffffffffff110);
        local_b60 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                              ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                               in_stack_ffffffffffffef10,
                               (MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                               in_stack_ffffffffffffef08);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(local_8 + 0x1d),(ulong)local_24);
        Math::SpatialTransform::toMatrix(in_stack_fffffffffffff100);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>>
        ::operator*((MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                     *)in_stack_ffffffffffffef20,
                    (MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_ffffffffffffef18);
        std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator[]
                  ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
                   &local_8[0x14].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_844);
        local_db0 = (Matrix<double,_6,_6,_0,_6,_6> *)
                    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::noalias
                              ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                               in_stack_ffffffffffffef08);
        Eigen::NoAlias<Eigen::Matrix<double,6,6,0,6,6>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::MatrixBase> *)
                   in_stack_ffffffffffffef30,
                   (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
                    *)in_stack_ffffffffffffef28);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(local_8 + 0x1d),(ulong)local_24);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &local_8[0x15].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_844);
        local_df0 = (Matrix<double,_6,_1,_0,_6,_1> *)
                    Eigen::MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::noalias
                              (in_stack_ffffffffffffef08);
        Eigen::NoAlias<Eigen::Matrix<double,6,1,0,6,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::MatrixBase> *)
                   in_stack_ffffffffffffef30,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffef28);
      }
    }
  }
  local_e58.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = 0.0;
  local_e58.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = 0.0;
  local_e58.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = 0.0;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                       in_stack_ffffffffffffef10,(Index)in_stack_ffffffffffffef08);
  local_e58.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = -*pSVar10;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                       in_stack_ffffffffffffef10,(Index)in_stack_ffffffffffffef08);
  local_e58.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = -*pSVar10;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                       in_stack_ffffffffffffef10,(Index)in_stack_ffffffffffffef08);
  local_e58.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = -*pSVar10;
  other = &local_e58;
  SpatialVector_t::SpatialVector_t
            (in_stack_ffffffffffffef90,(double *)in_stack_ffffffffffffef88,
             (double *)in_stack_ffffffffffffef80,(double *)in_stack_ffffffffffffef78,
             in_stack_ffffffffffffef70,in_stack_ffffffffffffef68,(double *)in_stack_ffffffffffffefa0
            );
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  SpatialVector_t::operator=((SpatialVector_t *)in_stack_ffffffffffffef10,(SpatialVector_t *)other);
  local_24 = 1;
  while( true ) {
    uVar4 = (ulong)local_24;
    sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&local_8[0x20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (sVar5 <= uVar4) break;
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                *)&local_8[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_8,(ulong)local_24);
    uVar2 = *pvVar7;
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(local_8 + 0x1d),(ulong)local_24);
    Math::SpatialTransform::SpatialTransform(in_stack_ffffffffffffef10,other);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)uVar2);
    Math::SpatialTransform::apply(in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &local_8[0x13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
              (in_stack_ffffffffffffef38,
               (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_ffffffffffffef30);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_ffffffffffffef10,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)other);
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&local_8[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
    if (pvVar6->mDoFCount == 3) {
      std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::operator[]
                ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)
                 &local_8[0x10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)
                 &local_8[0x11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&local_8[0xf].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)other);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                 in_stack_ffffffffffffef10,
                 (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)other);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffef38,
                 (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)in_stack_ffffffffffffef30);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffef28,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                  *)in_stack_ffffffffffffef20);
      Vector3_t::
      Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                ((Vector3_t *)in_stack_ffffffffffffef10,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                  *)other);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           in_stack_ffffffffffffef10,(Index)other);
      in_stack_ffffffffffffef50 = (double *)*pSVar10;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffef10,(Index)other);
      *pSVar9 = (Scalar)in_stack_ffffffffffffef50;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           in_stack_ffffffffffffef10,(Index)other);
      in_stack_ffffffffffffef58 = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)*pSVar10;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffef10,(Index)other);
      *pSVar9 = (Scalar)in_stack_ffffffffffffef58;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           in_stack_ffffffffffffef10,(Index)other);
      SVar13 = *pSVar10;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffef10,(Index)other);
      *pSVar9 = SVar13;
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&local_8[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      Eigen::MatrixBase<Eigen::Matrix<double,6,3,0,6,3>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_ffffffffffffef10,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_ffffffffffffef38,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)in_stack_ffffffffffffef30);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_ffffffffffffef10,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                  *)other);
    }
    else {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffef10,(Index)other);
      in_stack_ffffffffffffef20 =
           (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(1.0 / *pSVar9);
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffef10,(Index)other);
      SVar12 = *pSVar9;
      in_stack_ffffffffffffef10 =
           (SpatialTransform *)
           std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                     ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                      &local_8[0x16].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      RVar11 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
               dot<Eigen::Matrix<double,6,1,0,6,1>>
                         ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                          in_stack_ffffffffffffef10,
                          (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)other);
      in_stack_ffffffffffffef28 =
           (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
            *)((double)in_stack_ffffffffffffef20 * (SVar12 - RVar11));
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffef10,(Index)other);
      *pSVar9 = (Scalar)in_stack_ffffffffffffef28;
      in_stack_ffffffffffffef38 =
           (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
           std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                     ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                      &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      in_stack_ffffffffffffef30 =
           (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
            *)std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                        ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                         &local_8[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                 in_stack_ffffffffffffef10,(Index)other);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
                (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_24);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_ffffffffffffef10,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                  *)other);
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsApplyConstraintForces (
		Model &model,
		const VectorNd &Tau,
		ConstraintSet &CS,
		VectorNd &QDDot
		) {
	LOG << "-------- " << __func__ << " --------" << std::endl;
	assert (QDDot.size() == model.dof_count);

	unsigned int i = 0;

	for (i = 1; i < model.mBodies.size(); i++) {
		model.IA[i] = model.I[i].toMatrix();;
		model.pA[i] = crossf(model.v[i],model.I[i] * model.v[i]);

		if (CS.f_ext_constraints[i] != SpatialVectorZero) {
			LOG << "External force (" << i << ") = " << model.X_base[i].toMatrixAdjoint() * CS.f_ext_constraints[i] << std::endl;
			model.pA[i] -= model.X_base[i].toMatrixAdjoint() * CS.f_ext_constraints[i];
		}
	}

// ClearLogOutput();

	LOG << "--- first loop ---" << std::endl;

	for (i = model.mBodies.size() - 1; i > 0; i--) {
		unsigned int q_index = model.mJoints[i].q_index;

		if (model.mJoints[i].mDoFCount == 3) {
			unsigned int lambda = model.lambda[i];

			model.multdof3_u[i] = Vector3d (Tau[q_index], Tau[q_index + 1], Tau[q_index + 2]) - model.multdof3_S[i].transpose() * model.pA[i];

			if (lambda != 0) {
				SpatialMatrix Ia = model.IA[i] - model.multdof3_U[i] * model.multdof3_Dinv[i] * model.multdof3_U[i].transpose();
				SpatialVector pa = model.pA[i] + Ia * model.c[i] + model.multdof3_U[i] * model.multdof3_Dinv[i] * model.multdof3_u[i];
#ifdef EIGEN_CORE_H
				model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#else
				model.IA[lambda] += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#endif
				LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose() << std::endl;
			}
		} else {
			model.u[i] = Tau[q_index] - model.S[i].dot(model.pA[i]);

			unsigned int lambda = model.lambda[i];
			if (lambda != 0) {
				SpatialMatrix Ia = model.IA[i] - model.U[i] * (model.U[i] / model.d[i]).transpose();
				SpatialVector pa = model.pA[i] + Ia * model.c[i] + model.U[i] * model.u[i] / model.d[i];
#ifdef EIGEN_CORE_H
				model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#else
				model.IA[lambda] += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#endif
				LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose() << std::endl;
			}
		}
	}
	
	model.a[0] = SpatialVector (0., 0., 0., -model.gravity[0], -model.gravity[1], -model.gravity[2]);

	for (i = 1; i < model.mBodies.size(); i++) {
		unsigned int q_index = model.mJoints[i].q_index;
		unsigned int lambda = model.lambda[i];
		SpatialTransform X_lambda = model.X_lambda[i];

		model.a[i] = X_lambda.apply(model.a[lambda]) + model.c[i];
		LOG << "a'[" << i << "] = " << model.a[i].transpose() << std::endl;

		if (model.mJoints[i].mDoFCount == 3) {
			Vector3d qdd_temp = model.multdof3_Dinv[i] * (model.multdof3_u[i] - model.multdof3_U[i].transpose() * model.a[i]);
			QDDot[q_index] = qdd_temp[0];
			QDDot[q_index + 1] = qdd_temp[1];
			QDDot[q_index + 2] = qdd_temp[2];
			model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
		} else {
			QDDot[q_index] = (1./model.d[i]) * (model.u[i] - model.U[i].dot(model.a[i]));
			model.a[i] = model.a[i] + model.S[i] * QDDot[q_index];
		}
	}

	LOG << "QDDot = " << QDDot.transpose() << std::endl;
}